

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

void term_schedule_vbell(Terminal *term,_Bool already_started,long startpoint)

{
  unsigned_long uVar1;
  long local_28;
  long ticks_already_gone;
  long startpoint_local;
  _Bool already_started_local;
  Terminal *term_local;
  
  if (already_started) {
    uVar1 = getticks();
    local_28 = uVar1 - startpoint;
  }
  else {
    local_28 = 0;
  }
  if (local_28 < 100) {
    term->in_vbell = true;
    uVar1 = schedule_timer(100 - (int)local_28,term_timer,term);
    term->vbell_end = uVar1;
  }
  else {
    term->in_vbell = false;
  }
  return;
}

Assistant:

static void term_schedule_vbell(Terminal *term, bool already_started,
                                long startpoint)
{
    long ticks_already_gone;

    if (already_started)
        ticks_already_gone = GETTICKCOUNT() - startpoint;
    else
        ticks_already_gone = 0;

    if (ticks_already_gone < VBELL_DELAY) {
        term->in_vbell = true;
        term->vbell_end = schedule_timer(VBELL_DELAY - ticks_already_gone,
                                         term_timer, term);
    } else {
        term->in_vbell = false;
    }
}